

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void in_memory_snapshot_rollback_test(void)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  __atomic_base<unsigned_long> metalen;
  size_t bodylen;
  uint uVar4;
  fdb_config *fconfig;
  char *pcVar5;
  fdb_kvs_handle **ppfVar6;
  ulong uVar7;
  char *pcVar8;
  fdb_kvs_handle **ppfVar9;
  char *unaff_R12;
  btree *doc;
  char *unaff_R14;
  fdb_kvs_handle **__s;
  fdb_kvs_handle *pfVar10;
  char *unaff_R15;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *snap_db;
  char str [15];
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  fdb_kvs_handle *pfStack_2eb8;
  fdb_kvs_handle *pfStack_2eb0;
  fdb_file_handle *pfStack_2ea8;
  fdb_iterator *pfStack_2ea0;
  fdb_doc *pfStack_2e98;
  fdb_kvs_handle *pfStack_2e90;
  timeval tStack_2e88;
  fdb_kvs_config fStack_2e78;
  fdb_config fStack_2e60;
  fdb_config *pfStack_2d68;
  fdb_kvs_handle *pfStack_2d60;
  fdb_kvs_handle *pfStack_2d58;
  fdb_file_handle *pfStack_2d50;
  fdb_kvs_handle *pfStack_2d48;
  char acStack_2d3f [15];
  filemgr *pfStack_2d30;
  docio_handle *pdStack_2d28;
  btreeblk_handle *pbStack_2d20;
  size_t sStack_2d18;
  filemgr *pfStack_2d10;
  docio_handle *pdStack_2d08;
  btreeblk_handle *pbStack_2d00;
  timeval tStack_2cf8;
  undefined1 auStack_2ce8 [76];
  uint uStack_2c9c;
  char *pcStack_2ba8;
  atomic<unsigned_long> aStack_2ba0;
  btree *pbStack_2b98;
  fdb_kvs_handle *pfStack_2b90;
  fdb_kvs_handle *pfStack_2b88;
  code *pcStack_2b80;
  uint uStack_2b6c;
  fdb_txn *pfStack_2b68;
  fdb_kvs_handle *pfStack_2b60;
  fdb_iterator *pfStack_2b58;
  fdb_snapshot_info_t *pfStack_2b50;
  int iStack_2b44;
  fdb_kvs_handle *pfStack_2b40;
  fdb_kvs_handle *apfStack_2b38 [3];
  uint64_t uStack_2b20;
  fdb_kvs_config fStack_2b18;
  char acStack_2b00 [8];
  timeval tStack_2af8;
  char acStack_2ae8 [256];
  btree bStack_29e8;
  char acStack_2998 [256];
  char acStack_2898 [256];
  fdb_config fStack_2798;
  fdb_kvs_handle **ppfStack_26a0;
  fdb_kvs_handle **ppfStack_2698;
  fdb_kvs_handle *pfStack_2690;
  fdb_kvs_handle **ppfStack_2688;
  fdb_kvs_handle *pfStack_2680;
  code *pcStack_2678;
  fdb_kvs_handle **ppfStack_2670;
  fdb_kvs_handle *pfStack_2668;
  fdb_kvs_handle *apfStack_2660 [9];
  fdb_kvs_config fStack_2618;
  timeval tStack_2600;
  fdb_kvs_handle *apfStack_25f0 [33];
  fdb_config fStack_24e8;
  fdb_kvs_handle *apfStack_23f0 [32];
  fdb_kvs_handle *apfStack_22f0 [32];
  fdb_kvs_handle afStack_21f0 [15];
  fdb_config *pfStack_1e8;
  char *pcStack_1e0;
  char *pcStack_1d0;
  char *pcStack_1c8;
  fdb_kvs_handle *local_1b0;
  fdb_file_handle *local_1a8;
  fdb_iterator *local_1a0;
  fdb_doc *local_198;
  fdb_kvs_handle *local_190;
  char local_187 [15];
  timeval local_178;
  undefined1 local_168 [72];
  fdb_config local_120;
  
  gettimeofday(&local_178,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig = &local_120;
  fdb_get_default_config();
  fVar1 = fdb_open(&local_1a8,"mvcc_test1",fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c26b;
  fconfig = (fdb_config *)(local_168 + 0x30);
  fdb_get_default_kvs_config();
  fVar1 = fdb_kvs_open_default(local_1a8,&local_1b0,(fdb_kvs_config *)fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c270;
  fconfig = (fdb_config *)0x1;
  unaff_R14 = "%d";
  unaff_R15 = local_187;
  unaff_R12 = "value";
  do {
    sprintf(unaff_R15,"%d",fconfig);
    pfVar10 = local_1b0;
    sVar3 = strlen(unaff_R15);
    fVar1 = fdb_set_kv(pfVar10,unaff_R15,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      in_memory_snapshot_rollback_test();
      goto LAB_0011c266;
    }
    uVar4 = (int)fconfig + 1;
    fconfig = (fdb_config *)(ulong)uVar4;
  } while (uVar4 != 4);
  fdb_commit(local_1a8,'\0');
  fVar1 = fdb_set_kv(local_1b0,"key4",4,"value",5);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c275;
  fVar1 = fdb_set_kv(local_1b0,"key5",4,"value",5);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c27a;
  fVar1 = fdb_commit(local_1a8,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c27f;
  fVar1 = fdb_rollback(&local_1b0,3);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c284;
  fconfig = (fdb_config *)local_168;
  fdb_get_kvs_info(local_1b0,(fdb_kvs_info *)fconfig);
  if (local_168._8_8_ != 3) {
    in_memory_snapshot_rollback_test();
  }
  fVar1 = fdb_snapshot_open(local_1b0,&local_190,0xffffffffffffffff);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c289;
  fdb_iterator_init(local_190,&local_1a0,(void *)0x0,0,(void *)0x0,0,0);
  fconfig = (fdb_config *)&local_198;
  local_198 = (fdb_doc *)0x0;
  unaff_R14 = (char *)0x3;
  do {
    fVar1 = fdb_iterator_get(local_1a0,(fdb_doc **)fconfig);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c266;
    fdb_doc_free(local_198);
    local_198 = (fdb_doc *)0x0;
    fVar1 = fdb_iterator_next(local_1a0);
    unaff_R14 = unaff_R14 + -1;
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  if (unaff_R14 == (char *)0x0) {
    fdb_iterator_close(local_1a0);
    fdb_kvs_close(local_190);
    fdb_close(local_1a8);
    fdb_shutdown();
    memleak_end();
    pcVar8 = "%s PASSED\n";
    if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
      pcVar8 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar8,"in-memory snapshot rollback test");
    return;
  }
  goto LAB_0011c28e;
LAB_0011c67b:
  pcStack_2678 = (code *)0x11c680;
  rollback_drop_multi_files_kvs_test();
LAB_0011c680:
  pcStack_2678 = (code *)0x11c685;
  rollback_drop_multi_files_kvs_test();
LAB_0011c685:
  pcStack_2678 = (code *)0x11c68a;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68a:
  pcStack_2678 = (code *)0x11c68f;
  rollback_drop_multi_files_kvs_test();
LAB_0011c68f:
  pcStack_2678 = (code *)0x11c694;
  rollback_drop_multi_files_kvs_test();
LAB_0011c694:
  pcStack_2678 = (code *)0x11c699;
  rollback_drop_multi_files_kvs_test();
LAB_0011c699:
  pcStack_2678 = (code *)0x11c69e;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c69e;
LAB_0011cbcd:
  pcStack_2b80 = (code *)0x11cbd2;
  rollback_without_seqtree();
  goto LAB_0011cbd2;
LAB_0011cf63:
  pfStack_2d58 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_2d58 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
  goto LAB_0011cf6d;
LAB_0011c266:
  in_memory_snapshot_rollback_test();
LAB_0011c26b:
  in_memory_snapshot_rollback_test();
LAB_0011c270:
  in_memory_snapshot_rollback_test();
LAB_0011c275:
  in_memory_snapshot_rollback_test();
LAB_0011c27a:
  in_memory_snapshot_rollback_test();
LAB_0011c27f:
  in_memory_snapshot_rollback_test();
LAB_0011c284:
  in_memory_snapshot_rollback_test();
LAB_0011c289:
  in_memory_snapshot_rollback_test();
LAB_0011c28e:
  in_memory_snapshot_rollback_test();
  pcStack_2678 = (code *)0x11c2b0;
  pfStack_1e8 = fconfig;
  pcStack_1e0 = unaff_R12;
  pcStack_1d0 = unaff_R14;
  pcStack_1c8 = unaff_R15;
  gettimeofday(&tStack_2600,(__timezone_ptr_t)0x0);
  pcStack_2678 = (code *)0x11c2b5;
  memleak_start();
  pcStack_2678 = (code *)0x11c2c1;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_2678 = (code *)0x11c2d1;
  fdb_get_default_config();
  pcStack_2678 = (code *)0x11c2db;
  fdb_get_default_kvs_config();
  fStack_24e8.wal_threshold = 0x400;
  fStack_24e8.compaction_mode = 0;
  fStack_24e8.durability_opt = 2;
  pfVar10 = (fdb_kvs_handle *)(apfStack_22f0 + 0x20);
  ppfVar6 = apfStack_25f0;
  pcVar8 = "kvs%d";
  uVar7 = 0;
  __s = (fdb_kvs_handle **)0x0;
  do {
    pcStack_2678 = (code *)0x11c31b;
    sprintf((char *)ppfVar6,"mvcc_test%d",(ulong)__s & 0xffffffff);
    pcVar5 = (char *)(apfStack_2660 + (long)__s);
    pcStack_2678 = (code *)0x11c336;
    ppfVar9 = (fdb_kvs_handle **)pcVar5;
    fVar1 = fdb_open((fdb_file_handle **)pcVar5,(char *)ppfVar6,(fdb_config *)(apfStack_25f0 + 0x21)
                    );
    iVar2 = (int)ppfVar9;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c685;
    ppfVar9 = (fdb_kvs_handle **)0x0;
    ppfStack_2670 = __s;
    pfStack_2668 = pfVar10;
    do {
      __s = ppfVar9;
      pcStack_2678 = (code *)0x11c35b;
      sprintf((char *)ppfVar6,"kvs%d",(ulong)(uint)((int)__s + (int)uVar7));
      pfVar11 = *(fdb_kvs_handle **)pcVar5;
      pcStack_2678 = (code *)0x11c36e;
      fVar1 = fdb_kvs_open((fdb_file_handle *)pfVar11,(fdb_kvs_handle **)pfVar10,(char *)ppfVar6,
                           (fdb_kvs_config *)(apfStack_2660 + 9));
      iVar2 = (int)pfVar11;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStack_2678 = (code *)0x11c67b;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c67b;
      }
      pfVar10 = (fdb_kvs_handle *)&(pfVar10->kvs_config).custom_cmp;
      ppfVar9 = (fdb_kvs_handle **)((long)__s + 1);
    } while ((char *)((long)__s + 1) != (char *)0x80);
    __s = (fdb_kvs_handle **)((long)ppfStack_2670 + 1);
    uVar7 = uVar7 + 0x80;
    pfVar10 = (fdb_kvs_handle *)&pfStack_2668[1].bub_ctx.space_used;
  } while (__s != (fdb_kvs_handle **)0x8);
  __s = apfStack_25f0 + 0x40;
  ppfVar6 = apfStack_22f0;
  pfVar10 = (fdb_kvs_handle *)0x0;
  do {
    uVar7 = 0;
    do {
      pcStack_2678 = (code *)0x11c3cf;
      sprintf((char *)__s,"key%08d",uVar7);
      pcStack_2678 = (code *)0x11c3e2;
      sprintf((char *)ppfVar6,"value%08d",uVar7);
      pcVar8 = (char *)apfStack_22f0[(long)&pfVar10->op_stats];
      pcStack_2678 = (code *)0x11c3f2;
      sVar3 = strlen((char *)__s);
      pcVar5 = (char *)(sVar3 + 1);
      pcStack_2678 = (code *)0x11c3fe;
      sVar3 = strlen((char *)ppfVar6);
      pcStack_2678 = (code *)0x11c413;
      pfVar11 = (fdb_kvs_handle *)pcVar8;
      fVar1 = fdb_set_kv((fdb_kvs_handle *)pcVar8,__s,(size_t)pcVar5,ppfVar6,sVar3 + 1);
      iVar2 = (int)pfVar11;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c67b;
      uVar4 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar4;
    } while (uVar4 != 10);
    pfVar10 = (fdb_kvs_handle *)&(pfVar10->kvs_config).field_0x1;
  } while (pfVar10 != (fdb_kvs_handle *)0x400);
  pcVar5 = (char *)0x0;
  do {
    pfVar11 = apfStack_2660[(long)pcVar5];
    if (((ulong)pcVar5 & 1) == 0) {
      pcStack_2678 = (code *)0x11c441;
      fVar1 = fdb_commit((fdb_file_handle *)pfVar11,'\0');
      iVar2 = (int)pfVar11;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c6a3;
    }
    else {
      pcStack_2678 = (code *)0x11c454;
      fVar1 = fdb_commit((fdb_file_handle *)pfVar11,'\x01');
      iVar2 = (int)pfVar11;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c6a8;
    }
    pcVar5 = (char *)((long)pcVar5 + 1);
  } while (pcVar5 != (char *)0x8);
  pcVar5 = "key%08d";
  __s = apfStack_25f0 + 0x40;
  ppfVar6 = (fdb_kvs_handle **)0x0;
  do {
    uVar7 = 0;
    do {
      pcStack_2678 = (code *)0x11c488;
      sprintf((char *)__s,"key%08d",uVar7);
      pfVar10 = apfStack_22f0[(long)(ppfVar6 + 4)];
      pcStack_2678 = (code *)0x11c498;
      sVar3 = strlen((char *)__s);
      pcStack_2678 = (code *)0x11c4a7;
      pfVar11 = pfVar10;
      fVar1 = fdb_del_kv(pfVar10,__s,sVar3 + 1);
      iVar2 = (int)pfVar11;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c680;
      uVar4 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar4;
    } while (uVar4 != 10);
    ppfVar6 = (fdb_kvs_handle **)((long)ppfVar6 + 1);
  } while (ppfVar6 != (fdb_kvs_handle **)0x400);
  pcVar5 = (char *)0x0;
  do {
    pfVar11 = apfStack_2660[(long)pcVar5];
    if (((ulong)pcVar5 & 1) == 0) {
      pcStack_2678 = (code *)0x11c4d5;
      fVar1 = fdb_commit((fdb_file_handle *)pfVar11,'\0');
      iVar2 = (int)pfVar11;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c6ad;
    }
    else {
      pcStack_2678 = (code *)0x11c4e8;
      fVar1 = fdb_commit((fdb_file_handle *)pfVar11,'\x01');
      iVar2 = (int)pfVar11;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c6b2;
    }
    pcVar5 = (char *)((long)pcVar5 + 1);
  } while (pcVar5 != (char *)0x8);
  __s = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar5 = (char *)(apfStack_22f0 + 0x20);
  do {
    pcStack_2678 = (code *)0x11c515;
    ppfVar9 = (fdb_kvs_handle **)pcVar5;
    fVar1 = fdb_rollback((fdb_kvs_handle **)pcVar5,10);
    iVar2 = (int)ppfVar9;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c68a;
    __s = __s + 8;
    pcVar5 = (char *)((long)pcVar5 + 0x200);
  } while (__s < (fdb_kvs_handle **)0x3c0);
  ppfVar6 = apfStack_2660;
  pcVar5 = "kvs%d";
  __s = apfStack_25f0;
  pfVar10 = (fdb_kvs_handle *)0x0;
  do {
    pfVar11 = apfStack_22f0[(long)&pfVar10->op_stats];
    pcStack_2678 = (code *)0x11c555;
    fVar1 = fdb_kvs_close(pfVar11);
    iVar2 = (int)pfVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c694;
    pcStack_2678 = (code *)0x11c56d;
    sprintf((char *)__s,"kvs%d",(ulong)pfVar10 & 0xffffffff);
    pfVar11 = *ppfVar6;
    pcStack_2678 = (code *)0x11c579;
    fVar1 = fdb_kvs_remove((fdb_file_handle *)pfVar11,(char *)__s);
    iVar2 = (int)pfVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c68f;
    pfVar10 = (fdb_kvs_handle *)&(pfVar10->config).wal_threshold;
    ppfVar6 = ppfVar6 + 1;
  } while (pfVar10 != (fdb_kvs_handle *)0x400);
  pcVar5 = (char *)0x0;
  do {
    pfVar11 = apfStack_2660[(long)pcVar5];
    if (((ulong)pcVar5 & 1) == 0) {
      pcStack_2678 = (code *)0x11c5a5;
      fVar1 = fdb_commit((fdb_file_handle *)pfVar11,'\0');
      iVar2 = (int)pfVar11;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c6b7;
    }
    else {
      pcStack_2678 = (code *)0x11c5b8;
      fVar1 = fdb_commit((fdb_file_handle *)pfVar11,'\x01');
      iVar2 = (int)pfVar11;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c6bc;
    }
    pcVar5 = (char *)((long)pcVar5 + 1);
  } while (pcVar5 != (char *)0x8);
  pcVar5 = "mvcc_test_compact%d";
  __s = apfStack_25f0;
  pfVar10 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_2678 = (code *)0x11c5eb;
    sprintf((char *)__s,"mvcc_test_compact%d",(ulong)pfVar10 & 0xffffffff);
    pfVar11 = apfStack_2660[(long)pfVar10];
    pcStack_2678 = (code *)0x11c5f8;
    fVar1 = fdb_compact((fdb_file_handle *)pfVar11,(char *)__s);
    iVar2 = (int)pfVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011c699;
    pfVar10 = (fdb_kvs_handle *)&(pfVar10->kvs_config).field_0x1;
  } while (pfVar10 != (fdb_kvs_handle *)0x8);
  pcVar5 = (char *)0x0;
  pcStack_2678 = (code *)0x11c612;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar11 = apfStack_2660[(long)pcVar5];
    pcStack_2678 = (code *)0x11c61c;
    fVar1 = fdb_close((fdb_file_handle *)pfVar11);
    iVar2 = (int)pfVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pcVar5 = (char *)((long)pcVar5 + 1);
    if (pcVar5 == (char *)0x8) {
      pcStack_2678 = (code *)0x11c62e;
      fdb_shutdown();
      pcStack_2678 = (code *)0x11c633;
      memleak_end();
      pcVar8 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_2678 = (code *)0x11c664;
      fprintf(_stderr,pcVar8,"open multi files kvs test");
      return;
    }
  }
LAB_0011c69e:
  pcStack_2678 = (code *)0x11c6a3;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a3:
  pcStack_2678 = (code *)0x11c6a8;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6a8:
  pcStack_2678 = (code *)0x11c6ad;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6ad:
  pcStack_2678 = (code *)0x11c6b2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b2:
  pcStack_2678 = (code *)0x11c6b7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6b7:
  pcStack_2678 = (code *)0x11c6bc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c6bc:
  pcStack_2678 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_2b80 = (code *)0x11c6e3;
  ppfStack_26a0 = (fdb_kvs_handle **)pcVar5;
  ppfStack_2698 = ppfVar6;
  pfStack_2690 = (fdb_kvs_handle *)pcVar8;
  ppfStack_2688 = __s;
  pfStack_2680 = pfVar10;
  pcStack_2678 = (code *)uVar7;
  gettimeofday(&tStack_2af8,(__timezone_ptr_t)0x0);
  pcStack_2b80 = (code *)0x11c6e8;
  memleak_start();
  pcStack_2b80 = (code *)0x11c6f8;
  fdb_get_default_config();
  pcStack_2b80 = (code *)0x11c702;
  fdb_get_default_kvs_config();
  fStack_2798.flags = 1;
  fStack_2798.block_reusing_threshold = 0;
  fStack_2798.seqtree_opt = 0;
  pcStack_2b80 = (code *)0x11c728;
  fStack_2798.multi_kv_instances = (bool)(char)iVar2;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_2b80 = (code *)0x11c73c;
  fdb_open((fdb_file_handle **)&pfStack_2b68,"./mvcc_test1",(fdb_config *)(acStack_2898 + 0x100));
  iStack_2b44 = iVar2;
  if (iVar2 == 0) {
    pcStack_2b80 = (code *)0x11c7a8;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_2b68,apfStack_2b38,&fStack_2b18);
    pcVar8 = (char *)0x1;
  }
  else {
    ppfVar6 = apfStack_2b38;
    uVar7 = 0;
    do {
      pcStack_2b80 = (code *)0x11c76d;
      sprintf(acStack_2b00,"kv%d",uVar7 & 0xffffffff);
      pcStack_2b80 = (code *)0x11c780;
      fdb_kvs_open((fdb_file_handle *)pfStack_2b68,ppfVar6,acStack_2b00,&fStack_2b18);
      uVar7 = uVar7 + 1;
      ppfVar6 = ppfVar6 + 1;
    } while (uVar7 != 3);
    pcVar8 = (char *)0x3;
  }
  uStack_2b6c = 0;
  do {
    uVar7 = 0;
    do {
      pcStack_2b80 = (code *)0x11c7d4;
      sprintf(acStack_2998,"key%d",uVar7 & 0xffffffff);
      pcStack_2b80 = (code *)0x11c7f5;
      sprintf(acStack_2ae8,"meta-%d-%d",(ulong)uStack_2b6c,uVar7 & 0xffffffff);
      pcStack_2b80 = (code *)0x11c814;
      sprintf(acStack_2898,"body-%d-%d",(ulong)uStack_2b6c,uVar7 & 0xffffffff);
      doc = (btree *)(&bStack_29e8.ksize + uVar7 * 8);
      pcStack_2b80 = (code *)0x11c827;
      sVar3 = strlen(acStack_2998);
      pcStack_2b80 = (code *)0x11c837;
      metalen._M_i = strlen(acStack_2ae8);
      pcStack_2b80 = (code *)0x11c842;
      bodylen = strlen(acStack_2898);
      pcStack_2b80 = (code *)0x11c867;
      fdb_doc_create((fdb_doc **)doc,acStack_2998,sVar3,acStack_2ae8,metalen._M_i,acStack_2898,
                     bodylen);
      pfVar10 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_2b80 = (code *)0x11c878;
        fdb_set(apfStack_2b38[(long)pfVar10],*(fdb_doc **)doc);
        pfVar10 = (fdb_kvs_handle *)((long)pfVar10 + 1);
      } while ((fdb_kvs_handle *)pcVar8 != pfVar10);
      pcStack_2b80 = (code *)0x11c88d;
      fdb_doc_free(*(fdb_doc **)(&bStack_29e8.ksize + uVar7 * 8));
      uVar7 = uVar7 + 1;
    } while (uVar7 != 10);
    pcStack_2b80 = (code *)0x11c8b1;
    fdb_commit((fdb_file_handle *)pfStack_2b68,~(byte)uStack_2b6c & 1);
    uStack_2b6c = uStack_2b6c + 1;
    pcVar5 = (char *)(ulong)uStack_2b6c;
  } while (uStack_2b6c != 5);
  pcStack_2b80 = (code *)0x11c8d4;
  fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_2b68,&pfStack_2b50,&uStack_2b20);
  pfVar11 = (fdb_kvs_handle *)0xa;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_2b80 = (code *)0x11c8f3;
    fVar1 = fdb_rollback(apfStack_2b38,(pfStack_2b50[3].kvs_markers)->seqnum);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cbd7;
    pfStack_2b60 = (fdb_kvs_handle *)0x0;
    pcVar5 = acStack_2898;
    pfVar11 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_2b80 = (code *)0x11c928;
      fVar1 = fdb_snapshot_open(apfStack_2b38[(long)pfVar11],&pfStack_2b40,0xffffffffffffffff);
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011cbb9:
        pcStack_2b80 = (code *)0x11cbbe;
        rollback_without_seqtree();
LAB_0011cbbe:
        pcStack_2b80 = (code *)0x11cbc3;
        rollback_without_seqtree();
LAB_0011cbc3:
        pcStack_2b80 = (code *)0x11cbc8;
        rollback_without_seqtree();
LAB_0011cbc8:
        pcStack_2b80 = (code *)0x11cbcd;
        rollback_without_seqtree();
        goto LAB_0011cbcd;
      }
      pcStack_2b80 = (code *)0x11c950;
      fVar1 = fdb_iterator_init(pfStack_2b40,&pfStack_2b58,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011cbb4:
        pcStack_2b80 = (code *)0x11cbb9;
        rollback_without_seqtree();
        goto LAB_0011cbb9;
      }
      metalen._M_i = 0;
      do {
        pcStack_2b80 = (code *)0x11c96a;
        fVar1 = fdb_iterator_get(pfStack_2b58,(fdb_doc **)&pfStack_2b60);
        if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011cb8f:
          pcStack_2b80 = (code *)0x11cb94;
          rollback_without_seqtree();
LAB_0011cb94:
          pcStack_2b80 = (code *)0x11cba4;
          rollback_without_seqtree();
LAB_0011cba4:
          pcStack_2b80 = (code *)0x11cbb4;
          rollback_without_seqtree();
          goto LAB_0011cbb4;
        }
        pcStack_2b80 = (code *)0x11c98b;
        sprintf(acStack_2998,"key%d",metalen._M_i);
        if (pfVar11 == (fdb_kvs_handle *)0x0) {
          pcStack_2b80 = (code *)0x11c9da;
          sprintf(acStack_2ae8,"meta-1-%d",metalen._M_i);
          pcStack_2b80 = (code *)0x11c9ee;
          sprintf(pcVar5,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_2b80 = (code *)0x11c9ae;
          sprintf(acStack_2ae8,"meta-%d-%d",4,metalen._M_i);
          pcStack_2b80 = (code *)0x11c9c7;
          sprintf(pcVar5,"body-%d-%d",4);
        }
        pfVar10 = pfStack_2b60;
        doc = (btree *)pfStack_2b60->op_stats;
        pcStack_2b80 = (code *)0x11ca0a;
        iVar2 = bcmp(doc,acStack_2998,*(size_t *)&pfStack_2b60->kvs_config);
        if (iVar2 != 0) {
          pcStack_2b80 = (code *)0x11cb8f;
          rollback_without_seqtree();
          goto LAB_0011cb8f;
        }
        doc = pfVar10->staletree;
        pcStack_2b80 = (code *)0x11ca2a;
        iVar2 = bcmp(doc,acStack_2ae8,(size_t)(pfVar10->kvs_config).custom_cmp);
        if (iVar2 != 0) goto LAB_0011cba4;
        doc = (pfVar10->field_6).seqtree;
        pcStack_2b80 = (code *)0x11ca45;
        iVar2 = bcmp(doc,pcVar5,(size_t)(pfVar10->kvs_config).custom_cmp_param);
        if (iVar2 != 0) goto LAB_0011cb94;
        pcStack_2b80 = (code *)0x11ca55;
        fdb_doc_free((fdb_doc *)pfVar10);
        pfStack_2b60 = (fdb_kvs_handle *)0x0;
        uVar4 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar4;
        pcStack_2b80 = (code *)0x11ca6b;
        fVar1 = fdb_iterator_next(pfStack_2b58);
      } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar4 != 10) goto LAB_0011cbbe;
      pcStack_2b80 = (code *)0x11ca88;
      fVar1 = fdb_iterator_close(pfStack_2b58);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cbc3;
      pcStack_2b80 = (code *)0x11ca9a;
      fVar1 = fdb_kvs_close(pfStack_2b40);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cbc8;
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
    } while (pfVar11 != (fdb_kvs_handle *)pcVar8);
    pcVar5 = (char *)0x0;
    do {
      pcStack_2b80 = (code *)0x11caba;
      fVar1 = fdb_kvs_close(apfStack_2b38[(long)pcVar5]);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cbcd;
      pcVar5 = pcVar5 + 1;
    } while (pcVar8 != pcVar5);
    pcStack_2b80 = (code *)0x11cadd;
    fVar1 = fdb_rollback_all((fdb_file_handle *)pfStack_2b68,pfStack_2b50[3].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cbdc;
    pcStack_2b80 = (code *)0x11caf4;
    fVar1 = fdb_free_snap_markers(pfStack_2b50,uStack_2b20);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_2b80 = (code *)0x11cb06;
      fdb_close((fdb_file_handle *)pfStack_2b68);
      pcStack_2b80 = (code *)0x11cb0b;
      fdb_shutdown();
      pcStack_2b80 = (code *)0x11cb10;
      memleak_end();
      pcVar8 = "single kv mode:";
      if ((char)iStack_2b44 != '\0') {
        pcVar8 = "multiple kv mode:";
      }
      pcStack_2b80 = (code *)0x11cb40;
      sprintf(acStack_2898,"rollback without seqtree in %s",pcVar8);
      pcVar8 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar8 = "%s FAILED\n";
      }
      pcStack_2b80 = (code *)0x11cb6d;
      fprintf(_stderr,pcVar8,acStack_2898);
      return;
    }
  }
  else {
LAB_0011cbd2:
    pcStack_2b80 = (code *)0x11cbd7;
    rollback_without_seqtree();
LAB_0011cbd7:
    pcStack_2b80 = (code *)0x11cbdc;
    rollback_without_seqtree();
LAB_0011cbdc:
    pcStack_2b80 = (code *)0x11cbe1;
    rollback_without_seqtree();
  }
  pcStack_2b80 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_2d58 = (fdb_kvs_handle *)0x11cc03;
  pcStack_2ba8 = pcVar5;
  aStack_2ba0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_2b98 = doc;
  pfStack_2b90 = pfVar10;
  pfStack_2b88 = pfVar11;
  pcStack_2b80 = (code *)pcVar8;
  gettimeofday(&tStack_2cf8,(__timezone_ptr_t)0x0);
  pfStack_2d58 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_2d58 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar8 = auStack_2ce8 + 0x48;
  pfStack_2d58 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_2d58 = (fdb_kvs_handle *)0x11cc36;
  fVar1 = fdb_open(&pfStack_2d50,"./mvcc_test2",(fdb_config *)pcVar8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar8 = auStack_2ce8;
    pfStack_2d58 = (fdb_kvs_handle *)0x11cc4b;
    fdb_get_default_kvs_config();
    pbStack_2d00 = (btreeblk_handle *)auStack_2ce8._16_8_;
    pfStack_2d10 = (filemgr *)auStack_2ce8._0_8_;
    pdStack_2d08 = (docio_handle *)auStack_2ce8._8_8_;
    pfStack_2d58 = (fdb_kvs_handle *)0x11cc6c;
    fVar1 = fdb_kvs_open_default(pfStack_2d50,&pfStack_2d48,(fdb_kvs_config *)&pfStack_2d10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
    pfStack_2d58 = (fdb_kvs_handle *)0x11cc82;
    fVar1 = fdb_begin_transaction(pfStack_2d50,'\x03');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
    pcVar8 = "key%d";
    pfVar10 = (fdb_kvs_handle *)acStack_2d3f;
    pfVar11 = (fdb_kvs_handle *)0x1565bd;
    uVar7 = 0;
    do {
      pfStack_2d58 = (fdb_kvs_handle *)0x11ccae;
      sprintf((char *)pfVar10,"key%d",uVar7);
      handle = pfStack_2d48;
      pfStack_2d58 = (fdb_kvs_handle *)0x11ccbb;
      sVar3 = strlen((char *)pfVar10);
      pfStack_2d58 = (fdb_kvs_handle *)0x11ccd2;
      fVar1 = fdb_set_kv(handle,pfVar10,sVar3,"value",5);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_2d58 = (fdb_kvs_handle *)0x11cf63;
        tx_crash_recover_test();
        goto LAB_0011cf63;
      }
      uVar4 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar4;
    } while (uVar4 != 10);
    pfStack_2d58 = (fdb_kvs_handle *)0x11ccef;
    fVar1 = fdb_end_transaction(pfStack_2d50,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
    pfStack_2d58 = (fdb_kvs_handle *)0x11cd07;
    fdb_compact(pfStack_2d50,"./mvcc_test3");
    pfStack_2d58 = (fdb_kvs_handle *)0x11cd15;
    fVar1 = fdb_begin_transaction(pfStack_2d50,'\x03');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
    pcVar8 = "key%d";
    pfVar10 = (fdb_kvs_handle *)acStack_2d3f;
    uVar4 = 0;
    do {
      pfStack_2d58 = (fdb_kvs_handle *)0x11cd3a;
      sprintf((char *)pfVar10,"key%d",(ulong)uVar4);
      pfVar11 = pfStack_2d48;
      pfStack_2d58 = (fdb_kvs_handle *)0x11cd47;
      sVar3 = strlen((char *)pfVar10);
      pfStack_2d58 = (fdb_kvs_handle *)0x11cd55;
      fVar1 = fdb_del_kv(pfVar11,pfVar10,sVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 10);
    pfStack_2d58 = (fdb_kvs_handle *)0x11cd72;
    fVar1 = fdb_get_file_info(pfStack_2d50,(fdb_file_info *)auStack_2ce8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
    pcVar8 = (char *)((ulong)auStack_2ce8._40_8_ / (ulong)uStack_2c9c);
    pfStack_2d58 = (fdb_kvs_handle *)0x11cd9a;
    fdb_close(pfStack_2d50);
    pfStack_2d58 = (fdb_kvs_handle *)0x11cd9f;
    fdb_shutdown();
    pfStack_2d58 = (fdb_kvs_handle *)0x11cdbe;
    iVar2 = _disk_dump("./mvcc_test3",(ulong)uStack_2c9c * (long)pcVar8,
                       (ulong)((uStack_2c9c >> 2) + uStack_2c9c * 2));
    if (iVar2 < 0) goto LAB_0011cf90;
    pfStack_2d58 = (fdb_kvs_handle *)0x11cde8;
    iVar2 = _disk_dump("./mvcc_test2",((long)pcVar8 * 4 + 8) * (ulong)uStack_2c9c,
                       (ulong)(uStack_2c9c >> 2));
    if (iVar2 < 0) goto LAB_0011cf95;
    pfStack_2d58 = (fdb_kvs_handle *)0x11ce07;
    fVar1 = fdb_open(&pfStack_2d50,"./mvcc_test3",(fdb_config *)(auStack_2ce8 + 0x48));
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
    pcVar8 = (char *)&pfStack_2d30;
    pfStack_2d58 = (fdb_kvs_handle *)0x11ce1c;
    fdb_get_default_kvs_config();
    pbStack_2d00 = pbStack_2d20;
    pfStack_2d10 = pfStack_2d30;
    pdStack_2d08 = pdStack_2d28;
    pfStack_2d58 = (fdb_kvs_handle *)0x11ce3d;
    fVar1 = fdb_kvs_open_default(pfStack_2d50,&pfStack_2d48,(fdb_kvs_config *)&pfStack_2d10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
    pfStack_2d58 = (fdb_kvs_handle *)0x11ce53;
    fVar1 = fdb_begin_transaction(pfStack_2d50,'\x03');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      uVar4 = 0;
      do {
        pfStack_2d58 = (fdb_kvs_handle *)0x11ce78;
        sprintf(acStack_2d3f,"key%d",(ulong)uVar4);
        pfVar11 = pfStack_2d48;
        pfStack_2d58 = (fdb_kvs_handle *)0x11ce85;
        sVar3 = strlen(acStack_2d3f);
        pfStack_2d58 = (fdb_kvs_handle *)0x11ce93;
        fVar1 = fdb_del_kv(pfVar11,acStack_2d3f,sVar3);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
        uVar4 = uVar4 + 1;
      } while (uVar4 != 10);
      pfStack_2d58 = (fdb_kvs_handle *)0x11ceab;
      fdb_abort_transaction(pfStack_2d50);
      pfVar11 = (fdb_kvs_handle *)&pfStack_2d30;
      uVar4 = 0;
      while( true ) {
        pfStack_2d58 = (fdb_kvs_handle *)0x11ced2;
        sprintf(acStack_2d3f,"key%d",(ulong)uVar4);
        pfVar10 = pfStack_2d48;
        pfStack_2d58 = (fdb_kvs_handle *)0x11cedf;
        sVar3 = strlen(acStack_2d3f);
        pfStack_2d58 = (fdb_kvs_handle *)0x11cef3;
        fVar1 = fdb_get_kv(pfVar10,acStack_2d3f,sVar3,(void **)pfVar11,&sStack_2d18);
        if (fVar1 != FDB_RESULT_SUCCESS) break;
        pfStack_2d58 = (fdb_kvs_handle *)0x11cf01;
        free(pfStack_2d30);
        uVar4 = uVar4 + 1;
        if (uVar4 == 10) {
          pfStack_2d58 = (fdb_kvs_handle *)0x11cf11;
          fdb_close(pfStack_2d50);
          pfStack_2d58 = (fdb_kvs_handle *)0x11cf16;
          fdb_shutdown();
          pfStack_2d58 = (fdb_kvs_handle *)0x11cf1b;
          memleak_end();
          pcVar8 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar8 = "%s FAILED\n";
          }
          pfStack_2d58 = (fdb_kvs_handle *)0x11cf4c;
          fprintf(_stderr,pcVar8,"crash recover test");
          return;
        }
      }
LAB_0011cf6d:
      pfVar10 = (fdb_kvs_handle *)acStack_2d3f;
      pcVar8 = "key%d";
      pfStack_2d58 = (fdb_kvs_handle *)0x11cf72;
      tx_crash_recover_test();
      goto LAB_0011cf72;
    }
  }
  else {
LAB_0011cf72:
    pfStack_2d58 = (fdb_kvs_handle *)0x11cf77;
    tx_crash_recover_test();
LAB_0011cf77:
    pfStack_2d58 = (fdb_kvs_handle *)0x11cf7c;
    tx_crash_recover_test();
LAB_0011cf7c:
    pfStack_2d58 = (fdb_kvs_handle *)0x11cf81;
    tx_crash_recover_test();
LAB_0011cf81:
    pfStack_2d58 = (fdb_kvs_handle *)0x11cf86;
    tx_crash_recover_test();
LAB_0011cf86:
    pfStack_2d58 = (fdb_kvs_handle *)0x11cf8b;
    tx_crash_recover_test();
LAB_0011cf8b:
    pfStack_2d58 = (fdb_kvs_handle *)0x11cf90;
    tx_crash_recover_test();
LAB_0011cf90:
    pfStack_2d58 = (fdb_kvs_handle *)0x11cf95;
    tx_crash_recover_test();
LAB_0011cf95:
    pfStack_2d58 = (fdb_kvs_handle *)0x11cf9a;
    tx_crash_recover_test();
LAB_0011cf9a:
    pfStack_2d58 = (fdb_kvs_handle *)0x11cf9f;
    tx_crash_recover_test();
LAB_0011cf9f:
    pfStack_2d58 = (fdb_kvs_handle *)0x11cfa4;
    tx_crash_recover_test();
  }
  pfStack_2d58 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_2d68 = (fdb_config *)pcVar8;
  pfStack_2d60 = pfVar10;
  pfStack_2d58 = pfVar11;
  gettimeofday(&tStack_2e88,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_2e98 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_2ea8,"./mvcc_test1",&fStack_2e60);
  fdb_kvs_open_default(pfStack_2ea8,&pfStack_2e90,&fStack_2e78);
  fdb_kvs_open(pfStack_2ea8,&pfStack_2eb0,"kv",&fStack_2e78);
  fVar1 = fdb_set_kv(pfStack_2eb0,"a",1,(void *)0x0,0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_set_kv(pfStack_2eb0,"b",1,(void *)0x0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_2ea8,'\x01');
    fVar1 = fdb_snapshot_open(pfStack_2eb0,&pfStack_2eb8,2);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar1 = fdb_iterator_init(pfStack_2eb8,&pfStack_2ea0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar1 = fdb_kvs_close(pfStack_2eb8);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar1 = fdb_kvs_close(pfStack_2eb0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar1 = fdb_kvs_remove(pfStack_2ea8,"kv");
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar1 = fdb_iterator_get(pfStack_2ea0,&pfStack_2e98);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_2e98);
    fVar1 = fdb_iterator_close(pfStack_2ea0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar1 = fdb_kvs_close(pfStack_2eb8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar1 = fdb_kvs_close(pfStack_2e90);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_close(pfStack_2ea8);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar8 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar8 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar8,"drop kv other handle test");
        return;
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void in_memory_snapshot_rollback_test()
{

    TEST_INIT();
    memleak_start();

    int i, r;
    char str[15];
    fdb_file_handle *file;
    fdb_kvs_handle *kvs, *snap_db;
    fdb_iterator *iterator;
    fdb_status status;
    fdb_config config;
    fdb_doc *rdoc;
    fdb_kvs_config kvs_config;
    fdb_kvs_info kvs_info;
    fdb_seqnum_t c, rollback_to = 3;

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    status = fdb_open(&file, "mvcc_test1", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set 3 keys commits
    for(i=1;i<=3;i++) {
        sprintf(str, "%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // commit  normal
    fdb_commit(file, FDB_COMMIT_NORMAL);

    // set 2 more and commit w/flush
    status = fdb_set_kv(kvs, (void *)"key4", 4, (void*)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_kv(kvs, (void *)"key5", 4, (void*)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // rollback to 3
    status = fdb_rollback(&kvs, rollback_to);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_get_kvs_info(kvs, &kvs_info);
    TEST_CHK(kvs_info.last_seqnum == rollback_to);

    // take a in-mem snapshot and iterate over kvs
    status = fdb_snapshot_open(kvs, &snap_db, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    rdoc = NULL;
    c = 0;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        c++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(c==rollback_to);

    fdb_iterator_close(iterator);
    fdb_kvs_close(snap_db);
    fdb_close(file);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("in-memory snapshot rollback test");
}